

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O3

BlockInfo * kernel::MakeBlockInfo(BlockInfo *__return_storage_ptr__,CBlockIndex *index,CBlock *data)

{
  uint uVar1;
  uint256 *puVar2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  unique_lock<std::recursive_mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (index == (CBlockIndex *)0x0) {
    __return_storage_ptr__->hash = &uint256::ZERO;
    __return_storage_ptr__->prev_hash = (uint256 *)0x0;
    __return_storage_ptr__->height = -1;
    __return_storage_ptr__->file_number = -1;
    __return_storage_ptr__->data_pos = 0;
    __return_storage_ptr__->chain_time_max = 0;
    __return_storage_ptr__->undo_data = (CBlockUndo *)0x0;
  }
  else {
    __return_storage_ptr__->hash = index->phashBlock;
    __return_storage_ptr__->file_number = -1;
    __return_storage_ptr__->data_pos = 0;
    __return_storage_ptr__->data = (CBlock *)0x0;
    __return_storage_ptr__->undo_data = (CBlockUndo *)0x0;
    if (index->pprev == (CBlockIndex *)0x0) {
      puVar2 = (uint256 *)0x0;
    }
    else {
      puVar2 = index->pprev->phashBlock;
    }
    __return_storage_ptr__->prev_hash = puVar2;
    __return_storage_ptr__->height = index->nHeight;
    __return_storage_ptr__->chain_time_max = index->nTimeMax;
    local_30._M_device = &cs_main.super_recursive_mutex;
    local_30._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&local_30);
    uVar1 = index->nDataPos;
    __return_storage_ptr__->file_number = index->nFile;
    __return_storage_ptr__->data_pos = uVar1;
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
  }
  __return_storage_ptr__->data = data;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

interfaces::BlockInfo MakeBlockInfo(const CBlockIndex* index, const CBlock* data)
{
    interfaces::BlockInfo info{index ? *index->phashBlock : uint256::ZERO};
    if (index) {
        info.prev_hash = index->pprev ? index->pprev->phashBlock : nullptr;
        info.height = index->nHeight;
        info.chain_time_max = index->GetBlockTimeMax();
        LOCK(::cs_main);
        info.file_number = index->nFile;
        info.data_pos = index->nDataPos;
    }
    info.data = data;
    return info;
}